

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::LevelTest_TestLevelMonitoringLowBitrate_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::LevelTest_TestLevelMonitoringLowBitrate_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>::
  SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x480);
  anon_unknown.dwarf_c1a11d::LevelTest_TestLevelMonitoringLowBitrate_Test::
  LevelTest_TestLevelMonitoringLowBitrate_Test
            ((LevelTest_TestLevelMonitoringLowBitrate_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }